

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

IterateResult __thiscall glcts::MissingQualifierTestGroup::MissingCase::iterate(MissingCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestLog *log;
  ContextInfo *pCVar2;
  RenderContext *renderCtx;
  glcts *this_00;
  glUniform4fFunc p_Var3;
  int iVar4;
  GLenum GVar5;
  GLint GVar6;
  undefined4 extraout_var;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  char *pcVar9;
  TestError *this_01;
  GLSLVersion glslVersion;
  char *extensionDirective;
  long lVar10;
  FBOSentry fbo;
  ProgramSources sources;
  ShaderProgram p;
  allocator<char> local_272;
  allocator<char> local_271;
  string local_270;
  undefined1 local_250 [8];
  void *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  int local_228;
  string local_220;
  value_type local_200;
  FBOSentry local_1e0;
  undefined1 local_1c8 [8];
  _Alloc_hider local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  int local_1a0;
  pointer local_198;
  pointer pbStack_190;
  int local_188;
  undefined1 *local_180;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_138;
  undefined1 local_118 [32];
  ShaderProgram local_f8;
  Functions *pFVar7;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar7 = (Functions *)CONCAT44(extraout_var,iVar4);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pCVar2 = ((this->super_TestCase).m_context)->m_contextInfo;
  local_f8.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1b763d6;
  _Var8 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                    ((pCVar2->m_extensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pCVar2->m_extensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var8._M_current ==
      (pCVar2->m_extensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  else {
    extensionDirective = (char *)0x0;
    local_1e0.m_gl = pFVar7;
    FBOSentry::init(&local_1e0,(EVP_PKEY_CTX *)&DAT_00000004);
    (*pFVar7->clearColor)(1.0,1.0,1.0,1.0);
    (*pFVar7->clear)(0x4000);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    GetDef2DVtxSrc_abi_cxx11_(&local_270,(glcts *)(ulong)this->m_glslVersion,glslVersion);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_250,local_270._M_dataplus._M_p,&local_271);
    this_00 = (glcts *)this->m_layoutQualifier;
    pcVar9 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    GetSolidShader_abi_cxx11_
              (&local_220,this_00,pcVar9,"#extension GL_KHR_blend_equation_advanced : require",
               extensionDirective);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,local_220._M_dataplus._M_p,&local_272);
    memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1c8,0,0xac);
    local_118._0_8_ = (pointer)0x0;
    local_118[8] = 0;
    local_118._9_7_ = 0;
    local_118[0x10] = 0;
    local_118._17_8_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1c8,(value_type *)local_250);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1b0,&local_200);
    glu::ShaderProgram::ShaderProgram(&local_f8,renderCtx,(ProgramSources *)local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_118);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_138);
    lVar10 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1c8 + lVar10));
      lVar10 = lVar10 + -0x18;
    } while (lVar10 != -0x18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if (local_250 != (undefined1  [8])&local_240) {
      operator_delete((void *)local_250,local_240._M_allocated_capacity + 1);
    }
    paVar1 = &local_270.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if (local_f8.m_program.m_info.linkOk == false) {
      glu::operator<<(log,&local_f8);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                 ,0x4f7);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*pFVar7->useProgram)(local_f8.m_program.m_program);
    GVar5 = (*pFVar7->getError)();
    glu::checkError(GVar5,"Program failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x4fb);
    (*pFVar7->disable)(0xbd0);
    (*pFVar7->enable)(0xbe2);
    (*pFVar7->blendEquation)(this->m_mode);
    GVar5 = (*pFVar7->getError)();
    glu::checkError(GVar5,"BlendEquation failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x501);
    p_Var3 = pFVar7->uniform4f;
    GVar6 = (*pFVar7->getUniformLocation)(local_f8.m_program.m_program,"uSrcCol");
    (*p_Var3)(GVar6,0.0,0.0,0.0,1.0);
    GVar5 = (*pFVar7->getError)();
    glu::checkError(GVar5,"Uniform failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x505);
    local_270._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"aPos","");
    local_250._0_4_ = 1;
    local_248 = (void *)((long)&local_240 + 8U);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,local_270._M_dataplus._M_p,
               local_270._M_dataplus._M_p + local_270._M_string_length);
    local_228 = 0;
    local_1c8._0_4_ = local_250._0_4_;
    local_1c0._M_p = (pointer)&local_1b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c0,local_248,(long)local_248 + local_240._M_allocated_capacity);
    local_1a0 = local_228;
    local_198 = (pointer)0x8;
    pbStack_190 = (pointer)0x400000002;
    local_188 = 0;
    local_180 = s_pos;
    if (local_248 != (void *)((long)&local_240 + 8U)) {
      operator_delete(local_248,local_240._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    GVar5 = (*pFVar7->getError)();
    glu::checkError(GVar5,"Attributes failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x508);
    local_250 = (undefined1  [8])0x600000000;
    local_248 = (void *)CONCAT44(local_248._4_4_,1);
    local_240._M_allocated_capacity = (size_type)s_indices;
    glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_f8.m_program.m_program,1,
              (VertexArrayBinding *)local_1c8,(PrimitiveList *)local_250,(DrawUtilCallback *)0x0);
    GVar5 = (*pFVar7->getError)();
    pcVar9 = "Pass";
    if (GVar5 != 0x502) {
      pcVar9 = "Fail";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(GVar5 != 0x502)
               ,pcVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_p != &local_1b0) {
      operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
    }
    glu::ShaderProgram::~ShaderProgram(&local_f8);
    FBOSentry::~FBOSentry(&local_1e0);
  }
  return STOP;
}

Assistant:

MissingQualifierTestGroup::MissingCase::IterateResult MissingQualifierTestGroup::MissingCase::iterate(void)
{
	const int			  dim = 4;
	const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
	TestLog&			  log = m_testCtx.getLog();

	// Check that extension is supported.
	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	FBOSentry fbo(gl, dim, dim, GL_RGBA8);

	tcu::Vec4 dstCol(1.f, 1.f, 1.f, 1.f);
	tcu::Vec4 srcCol(0.f, 0.f, 0.f, 1.f);

	// Clear to destination color.
	gl.clearColor(dstCol.x(), dstCol.y(), dstCol.z(), dstCol.w());
	gl.clear(GL_COLOR_BUFFER_BIT);

	// Setup program.
	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(
							 GetDef2DVtxSrc(m_glslVersion).c_str(),
							 GetSolidShader(m_layoutQualifier, glu::getGLSLVersionDeclaration(m_glslVersion)).c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}

	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	// Enable blending and set blend equation.
	gl.disable(GL_DITHER);
	gl.enable(GL_BLEND);
	gl.blendEquation(m_mode);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

	// Setup source color.
	gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uSrcCol"), srcCol.x(), srcCol.y(), srcCol.z(), srcCol.w());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform failed");

	glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Attributes failed");

	glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
			  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));

	glw::GLenum error = gl.getError();
	bool		pass  = (error == GL_INVALID_OPERATION);

	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail");

	return STOP;
}